

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::BasicAllTargetsStoreCS::Run(BasicAllTargetsStoreCS *this)

{
  bool bVar1;
  long lVar2;
  Vector<float,_4> *in_R8;
  Vector<float,_4> local_30;
  DataType local_20 [4];
  
  local_20[0] = 0xbf800000;
  local_20[1] = 0x40000000;
  local_20[2] = 0x40400000;
  local_20[3] = 0xc0800000;
  local_30.m_data[0] = -1.0;
  local_30.m_data[1] = 2.0;
  local_30.m_data[2] = 3.0;
  local_30.m_data[3] = -4.0;
  bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::Write<tcu::Vector<float,4>>
                    ((BasicAllTargetsStoreCS *)this,0,(GLenum)local_20,&local_30,in_R8);
  lVar2 = -1;
  if (bVar1) {
    local_20[0] = TYPE_FLOAT;
    local_20[1] = ~TYPE_FLOAT;
    local_20[2] = TYPE_FLOAT_VEC3;
    local_20[3] = ~TYPE_FLOAT_VEC3;
    local_30.m_data[0] = 1.4013e-45;
    local_30.m_data[1] = -NAN;
    local_30.m_data[2] = 4.2039e-45;
    local_30.m_data[3] = -NAN;
    bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::Write<tcu::Vector<int,4>>
                      ((BasicAllTargetsStoreCS *)this,0,(GLenum)local_20,(Vector<int,_4> *)&local_30
                       ,(Vector<int,_4> *)in_R8);
    if (bVar1) {
      local_20[0] = TYPE_FLOAT;
      local_20[1] = TYPE_FLOAT_VEC2;
      local_20[2] = TYPE_FLOAT_VEC3;
      local_20[3] = TYPE_FLOAT_VEC4;
      local_30.m_data[0] = 1.4013e-45;
      local_30.m_data[1] = 2.8026e-45;
      local_30.m_data[2] = 4.2039e-45;
      local_30.m_data[3] = 5.60519e-45;
      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
              Write<tcu::Vector<unsigned_int,4>>
                        ((BasicAllTargetsStoreCS *)this,0,(GLenum)local_20,
                         (Vector<unsigned_int,_4> *)&local_30,(Vector<unsigned_int,_4> *)in_R8);
      if (bVar1) {
        local_20[0] = TYPE_FLOAT;
        local_20[1] = ~TYPE_FLOAT;
        local_20[2] = TYPE_FLOAT_VEC3;
        local_20[3] = ~TYPE_FLOAT_VEC3;
        local_30.m_data[0] = 1.4013e-45;
        local_30.m_data[1] = -NAN;
        local_30.m_data[2] = 4.2039e-45;
        local_30.m_data[3] = -NAN;
        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::Write<tcu::Vector<int,4>>
                          ((BasicAllTargetsStoreCS *)this,1,(GLenum)local_20,
                           (Vector<int,_4> *)&local_30,(Vector<int,_4> *)in_R8);
        if (bVar1) {
          local_20[0] = TYPE_FLOAT;
          local_20[1] = TYPE_FLOAT_VEC2;
          local_20[2] = TYPE_FLOAT_VEC3;
          local_20[3] = TYPE_FLOAT_VEC4;
          local_30.m_data[0] = 1.4013e-45;
          local_30.m_data[1] = 2.8026e-45;
          local_30.m_data[2] = 4.2039e-45;
          local_30.m_data[3] = 5.60519e-45;
          bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                  Write<tcu::Vector<unsigned_int,4>>
                            ((BasicAllTargetsStoreCS *)this,1,(GLenum)local_20,
                             (Vector<unsigned_int,_4> *)&local_30,(Vector<unsigned_int,_4> *)in_R8);
          if (bVar1) {
            local_20[0] = 0xbf800000;
            local_20[1] = 0x40000000;
            local_20[2] = 0x40400000;
            local_20[3] = 0xc0800000;
            local_30.m_data[0] = -1.0;
            local_30.m_data[1] = 2.0;
            local_30.m_data[2] = 3.0;
            local_30.m_data[3] = -4.0;
            bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                    Write<tcu::Vector<float,4>>
                              ((BasicAllTargetsStoreCS *)this,1,(GLenum)local_20,&local_30,in_R8);
            if (bVar1) {
              local_20[0] = TYPE_FLOAT;
              local_20[1] = TYPE_FLOAT_VEC2;
              local_20[2] = TYPE_FLOAT_VEC3;
              local_20[3] = TYPE_FLOAT_VEC4;
              local_30.m_data[0] = 1.4013e-45;
              local_30.m_data[1] = 2.8026e-45;
              local_30.m_data[2] = 4.2039e-45;
              local_30.m_data[3] = 5.60519e-45;
              bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                      Write<tcu::Vector<unsigned_int,4>>
                                ((BasicAllTargetsStoreCS *)this,2,(GLenum)local_20,
                                 (Vector<unsigned_int,_4> *)&local_30,
                                 (Vector<unsigned_int,_4> *)in_R8);
              if (bVar1) {
                local_20[0] = 0xbf800000;
                local_20[1] = 0x40000000;
                local_20[2] = 0x40400000;
                local_20[3] = 0xc0800000;
                local_30.m_data[0] = -1.0;
                local_30.m_data[1] = 2.0;
                local_30.m_data[2] = 3.0;
                local_30.m_data[3] = -4.0;
                bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                        Write<tcu::Vector<float,4>>
                                  ((BasicAllTargetsStoreCS *)this,2,(GLenum)local_20,&local_30,in_R8
                                  );
                if (bVar1) {
                  local_20[0] = TYPE_FLOAT;
                  local_20[1] = ~TYPE_FLOAT;
                  local_20[2] = TYPE_FLOAT_VEC3;
                  local_20[3] = ~TYPE_FLOAT_VEC3;
                  local_30.m_data[0] = 1.4013e-45;
                  local_30.m_data[1] = -NAN;
                  local_30.m_data[2] = 4.2039e-45;
                  local_30.m_data[3] = -NAN;
                  bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                          Write<tcu::Vector<int,4>>
                                    ((BasicAllTargetsStoreCS *)this,2,(GLenum)local_20,
                                     (Vector<int,_4> *)&local_30,(Vector<int,_4> *)in_R8);
                  if (bVar1) {
                    local_20[0] = 0xbf800000;
                    local_20[1] = 0x40000000;
                    local_20[2] = 0x40400000;
                    local_20[3] = 0xc0800000;
                    local_30.m_data[0] = -1.0;
                    local_30.m_data[1] = 2.0;
                    local_30.m_data[2] = 3.0;
                    local_30.m_data[3] = -4.0;
                    bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                            Write<tcu::Vector<float,4>>
                                      ((BasicAllTargetsStoreCS *)this,3,(GLenum)local_20,&local_30,
                                       in_R8);
                    if (bVar1) {
                      local_20[0] = TYPE_FLOAT;
                      local_20[1] = ~TYPE_FLOAT;
                      local_20[2] = TYPE_FLOAT_VEC3;
                      local_20[3] = ~TYPE_FLOAT_VEC3;
                      local_30.m_data[0] = 1.4013e-45;
                      local_30.m_data[1] = -NAN;
                      local_30.m_data[2] = 4.2039e-45;
                      local_30.m_data[3] = -NAN;
                      bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                              Write<tcu::Vector<int,4>>
                                        ((BasicAllTargetsStoreCS *)this,3,(GLenum)local_20,
                                         (Vector<int,_4> *)&local_30,(Vector<int,_4> *)in_R8);
                      if (bVar1) {
                        local_20[0] = TYPE_FLOAT;
                        local_20[1] = TYPE_FLOAT_VEC2;
                        local_20[2] = TYPE_FLOAT_VEC3;
                        local_20[3] = TYPE_FLOAT_VEC4;
                        local_30.m_data[0] = 1.4013e-45;
                        local_30.m_data[1] = 2.8026e-45;
                        local_30.m_data[2] = 4.2039e-45;
                        local_30.m_data[3] = 5.60519e-45;
                        bVar1 = glcts::(anonymous_namespace)::BasicAllTargetsStoreCS::
                                Write<tcu::Vector<unsigned_int,4>>
                                          ((BasicAllTargetsStoreCS *)this,3,(GLenum)local_20,
                                           (Vector<unsigned_int,_4> *)&local_30,
                                           (Vector<unsigned_int,_4> *)in_R8);
                        lVar2 = (ulong)bVar1 - 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{

		if (!Write(T2D, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(T2D, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T2D, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;
		if (!Write(T3D, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T3D, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;
		if (!Write(T3D, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(TCM, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;
		if (!Write(TCM, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(TCM, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T2DA, GL_RGBA32F, vec4(-1.0f, 2.0f, 3.0f, -4.0f), vec4(-1.0f, 2.0f, 3.0f, -4.0f)))
			return ERROR;
		if (!Write(T2DA, GL_RGBA32I, ivec4(1, -2, 3, -4), ivec4(1, -2, 3, -4)))
			return ERROR;
		if (!Write(T2DA, GL_RGBA32UI, uvec4(1, 2, 3, 4), uvec4(1, 2, 3, 4)))
			return ERROR;

		return NO_ERROR;
	}